

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O1

char * testing::internal::ParseGoogleMockFlagValue(char *str,char *flag,bool def_optional)

{
  size_t __n;
  int iVar1;
  long *plVar2;
  long *plVar3;
  char *pcVar4;
  char *pcVar5;
  string flag_str;
  long *local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (flag == (char *)0x0 || str == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"--gmock_","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar2;
    }
    __n = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    iVar1 = strncmp(str,(char *)local_70,__n);
    if (iVar1 == 0) {
      pcVar5 = str + __n;
      if ((!def_optional) || (pcVar4 = pcVar5, *pcVar5 != '\0')) {
        pcVar4 = (char *)0x0;
        if (*pcVar5 == '=') {
          pcVar4 = pcVar5 + 1;
        }
      }
    }
    else {
      pcVar4 = (char *)0x0;
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
  }
  return pcVar4;
}

Assistant:

static const char* ParseGoogleMockFlagValue(const char* str,
                                            const char* flag,
                                            bool def_optional) {
  // str and flag must not be NULL.
  if (str == NULL || flag == NULL) return NULL;

  // The flag must start with "--gmock_".
  const std::string flag_str = std::string("--gmock_") + flag;
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return NULL;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return NULL;

  // Returns the string after "=".
  return flag_end + 1;
}